

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O1

bool __thiscall ON_SubDQuadNeighborhood::IsValid(ON_SubDQuadNeighborhood *this)

{
  ON_SubDFace *this_00;
  long lVar1;
  ON_SubDFace *this_01;
  ON_SubDVertex *(*papOVar2) [4];
  ON_SubDFace *pOVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint i;
  long lVar7;
  ON_SubDVertex *pOVar8;
  ON__UINT_PTR OVar9;
  ON_SubDFace *pOVar10;
  ON_SubDEdge *pOVar11;
  ON__UINT_PTR OVar12;
  ON_SubDEdge *pOVar13;
  uint uVar14;
  ON_SubDFace *pOVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ON_SubDEdge *(*papOVar20) [2];
  uint uVar21;
  int iVar22;
  int *piVar23;
  int iVar24;
  bool bVar25;
  uint side_fei [3];
  ON_SubDEdgePtr side_face_eptr;
  ON_SubDVertex *quad_vertex [4];
  ON_2dex grid_quad_vertex_dex [4];
  ON_SubDEdge *quad_edge [4];
  ON_SubDEdgePtr quad_eptr [4];
  ON_2dex grid_corner_dex [4];
  ON_2dex face_side_dex [4];
  ON_2dex face_corner_dex [4];
  ON_2dex grid_side_dex [4] [2];
  uint local_1a8 [4];
  ON_SubDEdge *(*local_198) [2];
  int *local_190;
  ON_SubDVertex *(*local_188) [4];
  ON_SubDFace *local_180;
  ON_SubDFace *(*local_178) [3];
  ON_SubDEdgePtr local_170;
  ON_SubDVertex *local_168 [4];
  ON_2dex local_148;
  ON_2dex local_140;
  ON_2dex local_138;
  ON_2dex local_130 [2];
  ON_SubDEdge *(*local_120) [2];
  ON_SubDEdge *local_118 [4];
  ON_SubDEdgePtr local_f8 [4];
  ON_2dex local_d8;
  ON_2dex local_d0;
  ON_2dex local_c8;
  ON_2dex local_c0;
  ON_2dex local_b8;
  ON_2dex local_b0;
  ON_2dex local_a8;
  ON_2dex local_a0;
  ON_2dex local_98;
  ON_2dex local_90;
  ON_2dex local_88;
  ON_2dex local_80;
  ON_2dex local_78;
  ON_2dex local_70;
  ON_2dex local_68;
  ON_2dex local_60;
  ON_2dex local_58;
  ON_2dex local_50;
  ON_2dex local_48;
  ON_2dex local_40 [2];
  
  lVar7 = 0;
  uVar14 = 0;
  do {
    uVar14 = uVar14 + this->m_bExtraordinaryCornerVertex[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  if (uVar14 == this->m_extraordinary_corner_vertex_count) {
    uVar14 = 0;
    lVar7 = -4;
    do {
      if (this->m_bBoundaryCrease[lVar7 + -1] == true) {
        if (this->m_bExactQuadrantPatch[lVar7 + -1] == true) goto LAB_00623d76;
        uVar14 = uVar14 + 1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0);
    if (uVar14 == this->m_exact_quadrant_patch_count) {
      lVar7 = 0;
      uVar14 = 0;
      do {
        uVar14 = uVar14 + this->m_bBoundaryCrease[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      if (((uVar14 == this->m_boundary_crease_count) &&
          (this_00 = this->m_face_grid[1][1], this_00 != (ON_SubDFace *)0x0)) &&
         (this_00->m_edge_count == 4)) {
        uVar14 = 0;
        iVar22 = 0;
        do {
          pOVar8 = ON_SubDFace::Vertex(this_00,uVar14);
          if (pOVar8 == (ON_SubDVertex *)0x0) {
LAB_00623d2f:
            ON_SubDIncrementErrorCount();
            iVar24 = 1;
          }
          else {
            iVar24 = 0;
            if (this->m_vertex_grid[1][1] == pOVar8) {
              pOVar8 = ON_SubDFace::Vertex(this_00,uVar14 + 1 & 3);
              if (pOVar8 == (ON_SubDVertex *)0x0) goto LAB_00623d2f;
              iVar24 = 0xb;
              if (this->m_vertex_grid[2][1] == pOVar8) {
                iVar22 = 1;
              }
              else {
                if (this->m_vertex_grid[1][2] != pOVar8) goto LAB_00623d2f;
                iVar22 = -1;
              }
            }
          }
          if (iVar24 != 0) {
            if (iVar24 != 0xb) {
              return false;
            }
            goto LAB_00623d65;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != 4);
        uVar14 = 4;
LAB_00623d65:
        if (uVar14 < 4 && iVar22 != 0) {
          local_178 = this->m_face_grid;
          ON_2dex::ON_2dex(&local_98,0,0);
          ON_2dex::ON_2dex(&local_90,2,0);
          ON_2dex::ON_2dex(&local_88,2,2);
          ON_2dex::ON_2dex(&local_80,0,2);
          ON_2dex::ON_2dex(&local_b8,1,0);
          ON_2dex::ON_2dex(&local_b0,2,1);
          ON_2dex::ON_2dex(&local_a8,1,2);
          ON_2dex::ON_2dex(&local_a0,0,1);
          ON_2dex::ON_2dex(&local_148,1,1);
          ON_2dex::ON_2dex(&local_140,2,1);
          ON_2dex::ON_2dex(&local_138,2,2);
          ON_2dex::ON_2dex(local_130,1,2);
          ON_2dex::ON_2dex(&local_d8,0,0);
          ON_2dex::ON_2dex(&local_d0,3,0);
          ON_2dex::ON_2dex(&local_c8,3,3);
          ON_2dex::ON_2dex(&local_c0,0,3);
          ON_2dex::ON_2dex(&local_78,1,0);
          ON_2dex::ON_2dex(&local_70,2,0);
          ON_2dex::ON_2dex(&local_68,3,1);
          ON_2dex::ON_2dex(&local_60,3,2);
          ON_2dex::ON_2dex(&local_58,2,3);
          ON_2dex::ON_2dex(&local_50,1,3);
          ON_2dex::ON_2dex(&local_48,0,2);
          ON_2dex::ON_2dex(local_40,0,1);
          uVar16 = uVar14 + iVar22 + 4;
          uVar17 = uVar14 + iVar22 + 7;
          if (-1 < (int)uVar16) {
            uVar17 = uVar16;
          }
          uVar16 = uVar16 - (uVar17 & 0xfffffffc);
          uVar19 = uVar14 + iVar22 * 2 + 4;
          uVar17 = uVar14 + iVar22 * 2 + 7;
          if (-1 < (int)uVar19) {
            uVar17 = uVar19;
          }
          uVar19 = uVar19 - (uVar17 & 0xfffffffc);
          uVar21 = uVar14 + iVar22 * 3 + 4;
          uVar17 = iVar22 * 3 + uVar14 + 7;
          if (-1 < (int)uVar21) {
            uVar17 = uVar21;
          }
          uVar21 = uVar21 - (uVar17 & 0xfffffffc);
          local_168[0] = ON_SubDFace::Vertex(this_00,uVar14);
          local_168[1] = ON_SubDFace::Vertex(this_00,uVar16);
          local_168[2] = ON_SubDFace::Vertex(this_00,uVar19);
          local_168[3] = ON_SubDFace::Vertex(this_00,uVar21);
          lVar7 = 0;
          local_f8[0].m_ptr = this_00->m_edge4[uVar14].m_ptr;
          local_f8[1].m_ptr = this_00->m_edge4[(int)uVar16].m_ptr;
          local_f8[2].m_ptr = this_00->m_edge4[(int)uVar19].m_ptr;
          local_f8[3].m_ptr = this_00->m_edge4[(int)uVar21].m_ptr;
          local_118[0] = ON_SubDEdgePtr::Edge(local_f8);
          local_118[1] = ON_SubDEdgePtr::Edge(local_f8 + 1);
          local_118[2] = ON_SubDEdgePtr::Edge(local_f8 + 2);
          local_118[3] = ON_SubDEdgePtr::Edge(local_f8 + 3);
          uVar14 = 1;
          do {
            if (lVar7 == 0x20) {
              papOVar20 = this->m_edge_grid;
              piVar23 = &local_78.j;
              uVar18 = 0;
              local_120 = papOVar20;
              bVar25 = false;
              local_188 = this->m_vertex_grid;
              goto LAB_006241e6;
            }
            lVar1 = *(long *)((long)local_118 + lVar7);
            if (((((((lVar1 == 0) || (*(long *)(lVar1 + 0x80) == 0)) ||
                   (*(long *)(lVar1 + 0x88) == 0)) ||
                  ((*(short *)(lVar1 + 100) == 0 ||
                   (pOVar8 = *(ON_SubDVertex **)((long)local_168 + lVar7),
                   pOVar8 == (ON_SubDVertex *)0x0)))) ||
                 ((pOVar8->m_edge_count < 2 ||
                  ((pOVar8->m_edges == (ON_SubDEdgePtr *)0x0 || (pOVar8->m_face_count == 0)))))) ||
                (pOVar8->m_faces == (ON_SubDFace **)0x0)) ||
               ((pOVar8 != this->m_vertex_grid[*(int *)((long)&local_148.i + lVar7)]
                           [*(int *)((long)&local_148.j + lVar7)] ||
                (lVar1 != *(long *)((long)this->m_center_edges + lVar7))))) break;
            pOVar8 = local_168[uVar14 & 3];
            OVar9 = ON_SubDEdgePtr::EdgeDirection
                              ((ON_SubDEdgePtr *)((long)&local_f8[0].m_ptr + lVar7));
            lVar7 = lVar7 + 8;
            uVar14 = uVar14 + 1;
          } while (pOVar8 == *(ON_SubDVertex **)(lVar1 + 0x80 + (1 - OVar9) * 8));
        }
      }
    }
  }
LAB_00623d76:
  ON_SubDIncrementErrorCount();
  return false;
LAB_006241e6:
  pOVar8 = local_168[uVar18];
  if ((pOVar8 != local_188[(&local_148)[uVar18].i][(&local_148)[uVar18].j]) ||
     (this_01 = local_178[(&local_b8)[uVar18].i][(&local_b8)[uVar18].j], this_00 == this_01))
  goto LAB_00624758;
  local_198 = papOVar20;
  if (this->m_bBoundaryCrease[uVar18] == true) {
    pOVar13 = local_118[uVar18];
    bVar4 = ON_SubDEdge::IsCrease(pOVar13);
    if ((((!bVar4) || (uVar14 = ON_SubDEdge::FaceArrayIndex(pOVar13,this_00), uVar14 == 0xffffffff))
        || ((pOVar13->m_face_count == 2 &&
            ((bVar4 = ON_SubDVertex::IsCreaseOrCorner(pOVar13->m_vertex[0]), !bVar4 ||
             (bVar4 = ON_SubDVertex::IsCreaseOrCorner(pOVar13->m_vertex[1]), !bVar4)))))) ||
       (this_01 != (ON_SubDFace *)0x0)) goto LAB_00624758;
  }
  else {
    if ((this_01 == (ON_SubDFace *)0x0) || (pOVar13 = local_118[uVar18], pOVar13->m_face_count != 2)
       ) goto LAB_00624758;
    bVar4 = ON_SubDEdge::IsCrease(pOVar13);
    if (bVar4) {
      if (pOVar13->m_vertex[0]->m_vertex_tag == Dart) {
        iVar24 = 0;
        iVar22 = 1;
      }
      else {
        bVar4 = ON_SubDVertex::IsCreaseOrCorner(pOVar13->m_vertex[0]);
        if (!bVar4) goto LAB_00624758;
        iVar24 = 1;
        iVar22 = 0;
      }
      if (pOVar13->m_vertex[1]->m_vertex_tag == Dart) {
        iVar22 = iVar22 + 1;
      }
      else {
        bVar4 = ON_SubDVertex::IsCreaseOrCorner(pOVar13->m_vertex[1]);
        if (!bVar4) goto LAB_00624758;
        iVar24 = iVar24 + 1;
      }
      if ((iVar22 == 0) || (iVar24 + iVar22 != 2)) goto LAB_00624758;
    }
    else {
      bVar4 = ON_SubDEdge::IsSmooth(pOVar13);
      if (!bVar4) goto LAB_00624758;
    }
    pOVar10 = (ON_SubDFace *)(pOVar13->m_face2[0].m_ptr & 0xfffffffffffffff8);
    pOVar15 = (ON_SubDFace *)(pOVar13->m_face2[1].m_ptr & 0xfffffffffffffff8);
    pOVar3 = pOVar15;
    if (((this_00 != pOVar10) && (pOVar3 = pOVar10, this_00 != pOVar15)) ||
       (((this_01 != pOVar3 || (local_190 = piVar23, local_120[uVar18][0] == (ON_SubDEdge *)0x0)) ||
        (papOVar20 = local_120 + uVar18, (*papOVar20)[1] == (ON_SubDEdge *)0x0))))
    goto LAB_00624758;
    local_1a8[2] = 0;
    local_1a8[0] = 0;
    local_1a8[1] = 0;
    uVar14 = ON_SubDFace::EdgeArrayIndex(this_01,pOVar13);
    local_1a8[1] = uVar14;
    if (uVar14 == 0xffffffff) goto LAB_00624758;
    local_170 = ON_SubDFace::EdgePtr(this_01,uVar14);
    pOVar11 = ON_SubDEdgePtr::Edge(&local_170);
    if (pOVar13 != pOVar11) goto LAB_00624758;
    OVar9 = ON_SubDEdgePtr::EdgeDirection(&local_170);
    OVar12 = ON_SubDEdgePtr::EdgeDirection(local_f8 + uVar18);
    uVar17 = (uint)this_01->m_edge_count;
    *(uint *)((long)local_1a8 + (ulong)((uint)(OVar9 == OVar12) << 3 ^ 8)) =
         ((uVar17 + uVar14) - 1) % uVar17;
    local_1a8[(ulong)(OVar9 == OVar12) * 2] = (local_1a8[1] + 1) % uVar17;
    pOVar13 = (*papOVar20)[0];
    pOVar11 = ON_SubDFace::Edge(this_01,local_1a8[0]);
    if ((pOVar13 != pOVar11) ||
       (pOVar13 = (*papOVar20)[1], pOVar11 = ON_SubDFace::Edge(this_01,local_1a8[2]),
       papOVar20 = local_198, piVar23 = local_190, pOVar13 != pOVar11)) goto LAB_00624758;
  }
  local_180 = local_178[(&local_98)[uVar18].i][(&local_98)[uVar18].j];
  if (this_00 == local_180) goto LAB_00624758;
  if ((pOVar8->m_edge_count == 4) && (pOVar8->m_face_count == 4)) {
    bVar4 = ON_SubDVertex::IsSmoothOrDart(pOVar8);
    if ((bVar4) && (this->m_bBoundaryCrease[uVar18] == false)) {
      bVar4 = this->m_bBoundaryCrease[(int)uVar18 - 1U & 3] == false;
    }
    else {
      bVar4 = false;
    }
  }
  else {
    bVar4 = false;
  }
  if (bVar4) {
    uVar14 = 0;
    local_190 = piVar23;
    do {
      pOVar13 = ON_SubDVertex::Edge(pOVar8,uVar14);
      if (pOVar13 == (ON_SubDEdge *)0x0) {
LAB_006245a0:
        ON_SubDIncrementErrorCount();
        iVar22 = 1;
        bVar6 = false;
      }
      else if (pOVar13->m_face_count == 2) {
        bVar5 = ON_SubDEdge::IsSmooth(pOVar13);
        iVar22 = 0x16;
        bVar6 = true;
        if (!bVar5) {
          bVar6 = ON_SubDEdge::IsCrease(pOVar13);
          if ((!bVar6) || (pOVar8->m_vertex_tag != Dart)) goto LAB_00624588;
          iVar22 = 0x16;
          bVar6 = true;
        }
      }
      else {
LAB_00624588:
        bVar6 = ON_SubDEdge::IsCrease(pOVar13);
        if (!bVar6) goto LAB_006245a0;
        iVar22 = 0x14;
        bVar4 = false;
        bVar6 = false;
      }
      if (!bVar6) goto LAB_006245d0;
      uVar14 = uVar14 + 1;
    } while (uVar14 != 4);
    iVar22 = 0x14;
LAB_006245d0:
    papOVar20 = local_198;
    piVar23 = local_190;
    if (iVar22 != 0x14) {
      return bVar25;
    }
  }
  pOVar3 = local_180;
  if (bVar4) {
    if ((local_180 == (ON_SubDFace *)0x0) || (this_01 == local_180)) {
LAB_00624758:
      ON_SubDIncrementErrorCount();
      return bVar25;
    }
    iVar22 = (&local_d8)[uVar18].i;
    iVar24 = (&local_d8)[uVar18].j;
    uVar14 = ON_SubDFace::VertexIndex(local_180,pOVar8);
    if ((uVar14 == 0xffffffff) ||
       (uVar14 = ON_SubDFace::VertexIndex(pOVar3,pOVar8), papOVar20 = local_198,
       uVar14 == 0xffffffff)) goto LAB_00624758;
    if (pOVar3->m_edge_count == 4) {
      if ((local_188[iVar22][iVar24] == (ON_SubDVertex *)0x0) ||
         (papOVar2 = local_188 + iVar22, pOVar8 = ON_SubDFace::Vertex(local_180,uVar14 & 3 ^ 2),
         pOVar8 != (*papOVar2)[iVar24])) goto LAB_00624758;
    }
    else if (local_188[iVar22][iVar24] != (ON_SubDVertex *)0x0) goto LAB_00624758;
  }
  if (this->m_bBoundaryCrease[uVar18] == false) {
    lVar7 = 0;
    do {
      pOVar8 = local_168[(int)uVar18 + (int)lVar7 & 3];
      pOVar13 = (*papOVar20)[lVar7];
      if ((pOVar8 != pOVar13->m_vertex[pOVar8 != pOVar13->m_vertex[0]]) ||
         (local_188[piVar23[lVar7 * 2 + -1]][piVar23[lVar7 * 2]] !=
          pOVar13->m_vertex[pOVar8 == pOVar13->m_vertex[0]])) goto LAB_00624758;
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
  }
  bVar25 = 2 < uVar18;
  uVar18 = uVar18 + 1;
  papOVar20 = papOVar20 + 1;
  piVar23 = piVar23 + 4;
  if (uVar18 == 4) {
    return bVar25;
  }
  goto LAB_006241e6;
}

Assistant:

bool ON_SubDQuadNeighborhood::IsValid() const
{
  unsigned int count = 0;
  for (unsigned int i = 0; i < 4; i++)
  {
    if (m_bExtraordinaryCornerVertex[i])
      count++;
  }
  if (count != m_extraordinary_corner_vertex_count)
    return ON_SUBD_RETURN_ERROR(false);

  count = 0;
  for (unsigned int i = 0; i < 4; i++)
  {
    if (m_bExactQuadrantPatch[i])
    {
      if (m_bExtraordinaryCornerVertex[i] )
        return ON_SUBD_RETURN_ERROR(false);
      count++;
    }
  }
  if (count != m_exact_quadrant_patch_count)
    return ON_SUBD_RETURN_ERROR(false);

  count = 0;
  for (unsigned int i = 0; i < 4; i++)
  {
    if (m_bBoundaryCrease[i])
    {
      //if ( m_bDartCrease[i] )
      //  return ON_SUBD_RETURN_ERROR(false);
      count++;
    }
  }
  if (count != m_boundary_crease_count)
    return ON_SUBD_RETURN_ERROR(false);

  //count = 0;
  //for (unsigned int i = 0; i < 4; i++)
  //{
  //  if (m_bDartCrease[i])
  //    count++;
  //}
  //if (count != m_dart_crease_count)
  //  return ON_SUBD_RETURN_ERROR(false);

  const ON_SubDFace* quad_face = m_face_grid[1][1];
  if (nullptr == quad_face || 4 != quad_face->m_edge_count)
    return ON_SUBD_RETURN_ERROR(false);

  int quad_fvi0 = 0;
  int quad_dir = 0;
  {
    for (quad_fvi0 = 0; quad_fvi0 < 4; quad_fvi0++)
    {
      const ON_SubDVertex* v = quad_face->Vertex(quad_fvi0);
      if ( nullptr == v )
        return ON_SUBD_RETURN_ERROR(false);
      if (m_vertex_grid[1][1] == v)
      {
        v = quad_face->Vertex((quad_fvi0+1)%4);
        if ( nullptr == v )
          return ON_SUBD_RETURN_ERROR(false);
        if (m_vertex_grid[2][1] == v)
          quad_dir = 1;
        else if (m_vertex_grid[1][2] == v)
          quad_dir = -1;
        else
          return ON_SUBD_RETURN_ERROR(false);
        break;
      }
    }
    if (0 == quad_dir || quad_fvi0 >= 4)
      return ON_SUBD_RETURN_ERROR(false);
  }

  const ON_2dex face_corner_dex[4] = { { 0, 0 }, { 2, 0 }, { 2, 2 }, { 0, 2 } };
  const ON_2dex face_side_dex[4] = { { 1, 0 }, { 2, 1 }, { 1, 2 }, { 0, 1 } };

  const ON_2dex grid_quad_vertex_dex[4] = { { 1,1 }, { 2,1 }, { 2,2 }, { 1,2 } };
  const ON_2dex grid_corner_dex[4] = { { 0, 0 }, { 3, 0 }, { 3, 3 }, { 0, 3 } };
  const ON_2dex grid_side_dex[4][2] = { {{ 1, 0 }, { 2, 0 }}, {{ 3, 1 }, { 3, 2 }}, {{ 2, 3 }, { 1, 3 }}, {{ 0, 2 }, { 0, 1 }} };

  ON_2dex dex;

  const int fvi_map[4] = {
    quad_fvi0,
    (quad_fvi0+4+quad_dir)%4,
    (quad_fvi0+4+2*quad_dir)%4,
    (quad_fvi0+4+3*quad_dir)%4};

  const ON_SubDVertex* quad_vertex[4] = {
    quad_face->Vertex(fvi_map[0]), 
    quad_face->Vertex(fvi_map[1]),
    quad_face->Vertex(fvi_map[2]),
    quad_face->Vertex(fvi_map[3]) };

  const ON_SubDEdgePtr quad_eptr[4] = {
    quad_face->m_edge4[fvi_map[0]],
    quad_face->m_edge4[fvi_map[1]], 
    quad_face->m_edge4[fvi_map[2]],
    quad_face->m_edge4[fvi_map[3]] };

  const ON_SubDEdge* quad_edge[4] = {
    quad_eptr[0].Edge(),
    quad_eptr[1].Edge(),
    quad_eptr[2].Edge(),
    quad_eptr[3].Edge() };

  for (unsigned int fi = 0; fi < 4; fi++)
  {
    if (nullptr == quad_edge[fi])
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == quad_edge[fi]->m_vertex[0])
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == quad_edge[fi]->m_vertex[1])
      return ON_SUBD_RETURN_ERROR(false);
    if (quad_edge[fi]->m_face_count < 1)
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == quad_vertex[fi])
      return ON_SUBD_RETURN_ERROR(false);
    if (quad_vertex[fi]->m_edge_count < 2 || nullptr == quad_vertex[fi]->m_edges )
      return ON_SUBD_RETURN_ERROR(false);
    if (quad_vertex[fi]->m_face_count < 1 || nullptr == quad_vertex[fi]->m_faces )
      return ON_SUBD_RETURN_ERROR(false);
    dex = grid_quad_vertex_dex[fi];
    if ( quad_vertex[fi] != m_vertex_grid[dex.i][dex.j])
      return ON_SUBD_RETURN_ERROR(false);
    if ( quad_edge[fi] != m_center_edges[fi] )
      return ON_SUBD_RETURN_ERROR(false);
    if ( quad_vertex[(fi+1)%4] != quad_edge[fi]->m_vertex[1-quad_eptr[fi].EdgeDirection()] )
      return ON_SUBD_RETURN_ERROR(false);
  }
  
  const ON_SubDFace* side_face[4] = {};
  const ON_SubDFace* corner_face[4] = {};

  for (unsigned int fi = 0; fi < 4; fi++)
  {
    dex = grid_quad_vertex_dex[fi];
    if (quad_vertex[fi] != m_vertex_grid[dex.i][dex.j])
      return ON_SUBD_RETURN_ERROR(false);

    dex = face_side_dex[fi];
    side_face[fi] = m_face_grid[dex.i][dex.j];
    if ( quad_face == side_face[fi])
      return ON_SUBD_RETURN_ERROR(false);

    if (m_bBoundaryCrease[fi])
    {
      // A tag of ON_SubDEdgeTag::SmoothX is an error here
      if ( false == quad_edge[fi]->IsCrease() )
        return ON_SUBD_RETURN_ERROR(false);

      if ( ON_UNSET_UINT_INDEX == quad_edge[fi]->FaceArrayIndex(quad_face) )
        return ON_SUBD_RETURN_ERROR(false);

      if (2 == quad_edge[fi]->m_face_count)
      {
        if ( false == quad_edge[fi]->m_vertex[0]->IsCreaseOrCorner())
          return ON_SUBD_RETURN_ERROR(false);
        if ( false == quad_edge[fi]->m_vertex[1]->IsCreaseOrCorner())
          return ON_SUBD_RETURN_ERROR(false);
      }

      if (nullptr != side_face[fi])
        return ON_SUBD_RETURN_ERROR(false);
    }
    else
    {
      if (nullptr == side_face[fi])
        return ON_SUBD_RETURN_ERROR(false);

      // A tag of ON_SubDEdgeTag::SmoothX is permitted here
      if ( 2 != quad_edge[fi]->m_face_count)
        return ON_SUBD_RETURN_ERROR(false);

      if (quad_edge[fi]->IsCrease())
      {
        unsigned int dart_count = 0;
        unsigned int crease_count = 0;
        if ( ON_SubDVertexTag::Dart == quad_edge[fi]->m_vertex[0]->m_vertex_tag)
          dart_count++;
        else if ( quad_edge[fi]->m_vertex[0]->IsCreaseOrCorner())
          crease_count++;
        else
          return ON_SUBD_RETURN_ERROR(false);

        if ( ON_SubDVertexTag::Dart == quad_edge[fi]->m_vertex[1]->m_vertex_tag)
          dart_count++;
        else if ( quad_edge[fi]->m_vertex[1]->IsCreaseOrCorner())
          crease_count++;
        else
          return ON_SUBD_RETURN_ERROR(false);

        if ( 0 == dart_count )
          return ON_SUBD_RETURN_ERROR(false);

        if ( 2 != dart_count + crease_count )
          return ON_SUBD_RETURN_ERROR(false);
      }
      else
      {
        if (false == quad_edge[fi]->IsSmooth())
          return ON_SUBD_RETURN_ERROR(false);
      }
      const ON_SubDFace* edge_faces[2] = { ON_SUBD_FACE_POINTER(quad_edge[fi]->m_face2[0].m_ptr), ON_SUBD_FACE_POINTER(quad_edge[fi]->m_face2[1].m_ptr) };
      if (quad_face == edge_faces[0])
      {
        if (side_face[fi] != edge_faces[1])
          return ON_SUBD_RETURN_ERROR(false);
      }
      else if (quad_face == edge_faces[1])
      {
        if (side_face[fi] != edge_faces[0])
          return ON_SUBD_RETURN_ERROR(false);
      }
      else
        return ON_SUBD_RETURN_ERROR(false);

      if (nullptr == m_edge_grid[fi][0] || nullptr == m_edge_grid[fi][1])
        return ON_SUBD_RETURN_ERROR(false);

      unsigned int side_fei[3] = {};
      side_fei[1] = side_face[fi]->EdgeArrayIndex(quad_edge[fi]);
      if ( ON_UNSET_UINT_INDEX == side_fei[1] )
        return ON_SUBD_RETURN_ERROR(false);

      const ON_SubDEdgePtr side_face_eptr = side_face[fi]->EdgePtr(side_fei[1]);
      if ( quad_edge[fi] != side_face_eptr.Edge())
        return ON_SUBD_RETURN_ERROR(false);

      unsigned int k = (side_face_eptr.EdgeDirection() == quad_eptr[fi].EdgeDirection()) ? 2 : 0;
      unsigned int side_face_edge_count = side_face[fi]->m_edge_count;
      side_fei[2-k] = (side_fei[1] + side_face_edge_count - 1) % side_face_edge_count;
      side_fei[k] = (side_fei[1] + 1) % side_face_edge_count;
      if ( m_edge_grid[fi][0] != side_face[fi]->Edge(side_fei[0]))
        return ON_SUBD_RETURN_ERROR(false);
      if ( m_edge_grid[fi][1] != side_face[fi]->Edge(side_fei[2]))
        return ON_SUBD_RETURN_ERROR(false);
    }

    dex = face_corner_dex[fi];
    corner_face[fi] = m_face_grid[dex.i][dex.j];
    if ( quad_face == corner_face[fi])
      return ON_SUBD_RETURN_ERROR(false);

    bool bCornerShouldExist 
      = 4 == quad_vertex[fi]->m_edge_count
      && 4 == quad_vertex[fi]->m_face_count
      && quad_vertex[fi]->IsSmoothOrDart()
      && false == m_bBoundaryCrease[fi]
      && false == m_bBoundaryCrease[(fi + 3) % 4];
    if (bCornerShouldExist)
    {
      for (unsigned int vei = 0; vei < 4; vei++)
      {
        const ON_SubDEdge* e = quad_vertex[fi]->Edge(vei);
        if ( nullptr == e)
          return ON_SUBD_RETURN_ERROR(false);
        if (2 == e->m_face_count)
        {
          if (e->IsSmooth())
            continue;
          if (e->IsCrease() && ON_SubDVertexTag::Dart == quad_vertex[fi]->m_vertex_tag)
            continue;
        }
        if (false == e->IsCrease())
          return ON_SUBD_RETURN_ERROR(false);
        bCornerShouldExist = false;
        break;
      }
    }

    dex = grid_corner_dex[fi];
    if (bCornerShouldExist)
    {
      if (nullptr == corner_face[fi])
        return ON_SUBD_RETURN_ERROR(false);
      if (side_face[fi] == corner_face[fi])
        return ON_SUBD_RETURN_ERROR(false);
      if (ON_UNSET_UINT_INDEX == corner_face[fi]->VertexIndex(quad_vertex[fi]))
        return ON_SUBD_RETURN_ERROR(false);
      const unsigned int corner_face_vi = corner_face[fi]->VertexIndex(quad_vertex[fi]);
      if ( ON_UNSET_UINT_INDEX == corner_face_vi)
        return ON_SUBD_RETURN_ERROR(false);
      if (4 == corner_face[fi]->m_edge_count)
      {
        if (nullptr == m_vertex_grid[dex.i][dex.j])
          return ON_SUBD_RETURN_ERROR(false);
        if ( corner_face[fi]->Vertex((corner_face_vi+2)%4) != m_vertex_grid[dex.i][dex.j] )
          return ON_SUBD_RETURN_ERROR(false);
      }
      else
      {
        if (nullptr != m_vertex_grid[dex.i][dex.j])
          return ON_SUBD_RETURN_ERROR(false);
      }
    }
    //else 
    //{
    //  if (nullptr != corner_face[fi])
    //    return ON_SUBD_RETURN_ERROR(false);
    //  if (nullptr != m_vertex_grid[dex.i][dex.j])
    //    return ON_SUBD_RETURN_ERROR(false);
    //}

    if (false == m_bBoundaryCrease[fi])
    {
      for (unsigned int j = 0; j < 2; j++)
      {
        const ON_SubDVertex* v = quad_vertex[(fi + j) % 4];
        unsigned int k = (v != m_edge_grid[fi][j]->m_vertex[0]) ? 0 : 1;
        if (v != m_edge_grid[fi][j]->m_vertex[1 - k])
          return ON_SUBD_RETURN_ERROR(false);
        dex = grid_side_dex[fi][j];
        if (m_vertex_grid[dex.i][dex.j] != m_edge_grid[fi][j]->m_vertex[k])
          return ON_SUBD_RETURN_ERROR(false);
      }
    }
  }

  return true;
}